

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

uint __thiscall nv::ColorBlock::countUniqueColors(ColorBlock *this)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  int local_20;
  int j;
  uint uStack_14;
  bool unique;
  int i;
  uint count;
  ColorBlock *this_local;
  
  uStack_14 = 0;
  for (j = 0; j < 0x10; j = j + 1) {
    bVar1 = true;
    for (local_20 = 0; local_20 < j; local_20 = local_20 + 1) {
      uVar2 = Color32::operator_cast_to_unsigned_int(this->m_color + j);
      uVar3 = Color32::operator_cast_to_unsigned_int(this->m_color + local_20);
      if (uVar2 != uVar3) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      uStack_14 = uStack_14 + 1;
    }
  }
  return uStack_14;
}

Assistant:

uint ColorBlock::countUniqueColors() const
{
	uint count = 0;

	// @@ This does not have to be o(n^2)
	for(int i = 0; i < 16; i++)
	{
		bool unique = true;
		for(int j = 0; j < i; j++) {
			if( m_color[i] != m_color[j] ) {
				unique = false;
			}
		}
		
		if( unique ) {
			count++;
		}
	}
	
	return count;
}